

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GreenRoomFour.cpp
# Opt level: O1

string * __thiscall
GreenRoomFour::getDescription_abi_cxx11_
          (string *__return_storage_ptr__,GreenRoomFour *this,bool longform)

{
  pointer pcVar1;
  itemLocation iVar2;
  undefined8 in_RAX;
  ItemWrapper *this_00;
  string *psVar3;
  long lVar4;
  undefined7 in_register_00000011;
  undefined8 uStack_18;
  
  if ((int)CONCAT71(in_register_00000011,longform) == 0) {
    uStack_18 = CONCAT44(0x18,(int)in_RAX);
    this_00 = ItemTable::getValue((this->super_Room).table,(itemType *)((long)&uStack_18 + 4));
    iVar2 = ItemWrapper::getLocation(this_00);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    if (iVar2 == HIDDEN) {
      psVar3 = &(this->super_Room).rstate2;
      lVar4 = 0x50;
    }
    else {
      psVar3 = &(this->super_Room).rstate1;
      lVar4 = 0x30;
    }
  }
  else {
    psVar3 = &(this->super_Room).rstate0;
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    lVar4 = 0x10;
    uStack_18 = in_RAX;
  }
  pcVar1 = (psVar3->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,pcVar1,
             pcVar1 + *(long *)((long)&(this->super_Room)._vptr_Room + lVar4));
  return __return_storage_ptr__;
}

Assistant:

std::string GreenRoomFour::getDescription(bool longform) {
    if(longform){
        return rstate0;
    }
    if(table->getValue(KID)->getLocation() == HIDDEN) {
        return rstate2;
    }
    return rstate1;
}